

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O2

int Dar_ManRewrite(Aig_Man_t *pAig,Dar_RwrPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  short sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Dar_Man_t *p_00;
  Vec_Int_t *pVVar8;
  Aig_Obj_t *pObj;
  abctime aVar9;
  abctime aVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *pAVar12;
  Dar_RwrPar_t *pDVar13;
  uint i;
  uint *puVar14;
  Vec_Ptr_t *p_01;
  uint uVar15;
  Dar_Cut_t *pCut;
  int local_54;
  int nMffcSize;
  Aig_Man_t *local_40;
  abctime local_38;
  
  Dar_LibPrepare(pPars->nSubgMax);
  p_00 = Dar_ManStart(pAig,pPars);
  if (pPars->fPower != 0) {
    pVVar8 = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,1);
    pAig->vProbs = pVVar8;
  }
  Aig_ManCleanup(pAig);
  pDVar13 = p_00->pPars;
  if (pDVar13->fFanout != 0) {
    Aig_ManFanoutStart(pAig);
    pDVar13 = p_00->pPars;
  }
  if (pDVar13->fUpdateLevel != 0) {
    Aig_ManStartReverseLevels(pAig,0);
  }
  local_38 = Abc_Clock();
  p_00->nNodesInit = pAig->nObjs[6] + pAig->nObjs[5];
  p_01 = pAig->vObjs;
  iVar7 = p_01->nSize;
  local_54 = 0;
  iVar5 = iVar7;
  local_40 = pAig;
  for (i = 0; (int)i < iVar5; i = i + 1) {
    pAVar12 = (Aig_Obj_t *)(ulong)i;
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_01,i);
    if (pObj != (Aig_Obj_t *)0x0) {
      if ((((i >> 8 & 1) == 0) && (pAig->Time2Quit != 0)) &&
         (aVar9 = Abc_Clock(), pAig->Time2Quit < aVar9)) break;
      if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
        if (iVar7 < (int)i) break;
        if ((pPars->fRecycle != 0) && (local_54 = local_54 + 1, local_54 % 50000 == 0)) {
          iVar5 = Aig_DagSize(pObj);
          pAVar12 = (Aig_Obj_t *)0x64;
          if (iVar5 < p_00->vCutNodes->nSize / 100) {
            pAVar12 = pObj;
            Dar_ManCutsRestart(p_00,pObj);
          }
        }
        p_00->nNodesTried = p_00->nNodesTried + 1;
        aVar9 = Abc_Clock();
        Dar_ObjSetCuts(pObj,(Dar_Cut_t *)pAVar12);
        pAVar12 = pObj;
        Dar_ObjComputeCuts_rec(p_00,pObj);
        aVar10 = Abc_Clock();
        p_00->timeCuts = p_00->timeCuts + (aVar10 - aVar9);
        puVar14 = (uint *)((long)(pObj->field_5).pData + 4);
        for (uVar15 = 0; uVar6 = (uint)(byte)pObj->field_0x1f, uVar15 < (byte)pObj->field_0x1f;
            uVar15 = uVar15 + 1) {
          uVar1 = *puVar14;
          if ((uVar1 >> 0x1c & 1) != 0) {
            if (uVar1 < 0x20000000) break;
            if ((uVar1 & 0xe0000000) == 0x20000000) {
              uVar6 = puVar14[1];
              pAVar12 = (Aig_Obj_t *)(ulong)uVar6;
              if ((uVar6 != pObj->Id) &&
                 (pAVar11 = Aig_ManObj(p_00->pAig,uVar6), pAVar11 != (Aig_Obj_t *)0x0)) {
                uVar6 = (uint)(byte)pObj->field_0x1f;
                break;
              }
            }
          }
          puVar14 = puVar14 + 6;
        }
        if (uVar15 < uVar6) {
          uVar15 = *puVar14;
          if (0x3fffffff < uVar15) {
            __assert_fail("pCut->nLeaves < 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCore.c"
                          ,0x95,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
          }
          sVar4 = (short)uVar15;
          if (uVar15 < 0x20000000) {
            if ((sVar4 != 0) && ((uVar15 & 0xffff) != 0xffff)) {
              __assert_fail("pCut->uTruth == 0 || pCut->uTruth == 0xFFFF",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCore.c"
                            ,0x98,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            pAVar11 = (Aig_Obj_t *)((ulong)(sVar4 == 0) ^ (ulong)p_00->pAig->pConst1);
          }
          else {
            if ((sVar4 != 0x5555) && ((uVar15 & 0xffff) != 0xaaaa)) {
              __assert_fail("pCut->uTruth == 0xAAAA || pCut->uTruth == 0x5555",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCore.c"
                            ,0x9d,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            pAVar12 = (Aig_Obj_t *)(ulong)puVar14[1];
            pAVar11 = Aig_ManObj(p_00->pAig,puVar14[1]);
            pAVar11 = (Aig_Obj_t *)((ulong)((short)*puVar14 == 0x5555) ^ (ulong)pAVar11);
          }
          Dar_ObjSetCuts(pObj,(Dar_Cut_t *)pAVar12);
          Aig_ObjReplace(pAig,pObj,pAVar11,p_00->pPars->fUpdateLevel);
        }
        else {
          p_00->GainBest = -1;
          nMffcSize = -1;
          if (pAig->vLevelR == (Vec_Int_t *)0x0) {
            iVar5 = 1000000000;
          }
          else {
            pAVar12 = pObj;
            iVar5 = Aig_ObjRequiredLevel(pAig,pObj);
          }
          pCut = (Dar_Cut_t *)(pObj->field_5).pData;
          for (uVar15 = 0; p = local_40, uVar15 < (byte)pObj->field_0x1f; uVar15 = uVar15 + 1) {
            uVar6 = *(uint *)&pCut->field_0x4;
            if ((uVar6 >> 0x1c & 1) != 0) {
              if ((uVar6 & 0xe0000000) == 0x60000000) {
                *(uint *)&pCut->field_0x4 = uVar6 & 0x1fffffff | 0x80000000;
                pCut->pLeaves[3] = 0;
              }
              pAVar12 = pObj;
              Dar_LibEval(p_00,pObj,pCut,iVar5,&nMffcSize);
              *(uint *)&pCut->field_0x4 =
                   *(uint *)&pCut->field_0x4 & 0x1fffffff | uVar6 & 0xe0000000;
            }
            pCut = pCut + 1;
          }
          if ((0 < p_00->GainBest) ||
             ((pAig = local_40, p_00->GainBest == 0 && (p_00->pPars->fUseZeros != 0)))) {
            Dar_ObjSetCuts(pObj,(Dar_Cut_t *)pAVar12);
            iVar2 = p->nObjs[5];
            iVar3 = p->nObjs[6];
            pAVar12 = Dar_LibBuildBest(p_00);
            if (iVar5 < (int)(*(uint *)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x1c) & 0xffffff)) {
              __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCore.c"
                            ,0xc0,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            Aig_ObjReplace(p,pObj,(Aig_Obj_t *)
                                  ((ulong)(((*(uint *)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18)
                                            ^ *(uint *)&pObj->field_0x18) >> 3 ^ (uint)pAVar12) & 1)
                                  ^ (ulong)pAVar12),p_00->pPars->fUpdateLevel);
            iVar5 = (iVar3 + iVar2) - (p->nObjs[5] + p->nObjs[6]);
            if (iVar5 < p_00->GainBest) {
              __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCore.c"
                            ,0xc5,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            p_00->ClassGains[p_00->ClassBest] = p_00->ClassGains[p_00->ClassBest] + iVar5;
            pAig = local_40;
          }
        }
      }
    }
    p_01 = pAig->vObjs;
    iVar5 = p_01->nSize;
  }
  aVar9 = Abc_Clock();
  p_00->timeTotal = aVar9 - local_38;
  p_00->timeOther = (aVar9 - local_38) - (p_00->timeCuts + p_00->timeEval);
  Dar_ManCutsFree(p_00);
  pDVar13 = p_00->pPars;
  if (pDVar13->fFanout != 0) {
    Aig_ManFanoutStop(pAig);
    pDVar13 = p_00->pPars;
  }
  if (pDVar13->fUpdateLevel != 0) {
    Aig_ManStopReverseLevels(pAig);
  }
  pVVar8 = pAig->vProbs;
  if (pVVar8 != (Vec_Int_t *)0x0) {
    free(pVVar8->pArray);
    free(pVVar8);
    pAig->vProbs = (Vec_Int_t *)0x0;
  }
  Dar_ManStop(p_00);
  Aig_ManCheckPhase(pAig);
  iVar7 = Aig_ManCheck(pAig);
  if (iVar7 == 0) {
    puts("Aig_ManRewrite: The network check has failed.");
  }
  return (uint)(iVar7 != 0);
}

Assistant:

int Dar_ManRewrite( Aig_Man_t * pAig, Dar_RwrPar_t * pPars )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Dar_Man_t * p;
//    Bar_Progress_t * pProgress;
    Dar_Cut_t * pCut;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k, nNodesOld, nNodeBefore, nNodeAfter, Required;
    abctime clk = 0, clkStart;
    int Counter = 0;
    int nMffcSize;//, nMffcGains[MAX_VAL+1][MAX_VAL+1] = {{0}};
    // prepare the library
    Dar_LibPrepare( pPars->nSubgMax ); 
    // create rewriting manager
    p = Dar_ManStart( pAig, pPars );
    if ( pPars->fPower )
        pAig->vProbs = Saig_ManComputeSwitchProbs( pAig, 48, 16, 1 );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    if ( p->pPars->fFanout )
        Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );
    // set elementary cuts for the PIs
//    Dar_ManCutsStart( p );
    // resynthesize each node once
    clkStart = Abc_Clock();
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );

//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
//    pProgress = Bar_ProgressStart( stdout, 100 );
//    Aig_ManOrderStart( pAig );
//    Aig_ManForEachNodeInOrder( pAig, pObj )
    {
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
//        Bar_ProgressUpdate( pProgress, 100*pAig->nAndPrev/pAig->nAndTotal, NULL );
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
//        if ( p->pPars->fUseZeros && i > nNodesOld )
            break;
        if ( pPars->fRecycle && ++Counter % 50000 == 0 && Aig_DagSize(pObj) < Vec_PtrSize(p->vCutNodes)/100 )
        {
//            printf( "Counter = %7d.  Node = %7d.  Dag = %5d. Vec = %5d.\n", 
//                Counter, i, Aig_DagSize(pObj), Vec_PtrSize(p->vCutNodes) );
//            fflush( stdout );
            Dar_ManCutsRestart( p, pObj );
        }

        // consider freeing the cuts
//        if ( (i & 0xFFF) == 0 && Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) > 100 )
//            Dar_ManCutsStart( p );

        // compute cuts for the node
        p->nNodesTried++;
clk = Abc_Clock();
        Dar_ObjSetCuts( pObj, NULL );
        Dar_ObjComputeCuts_rec( p, pObj );
p->timeCuts += Abc_Clock() - clk;

        // check if there is a trivial cut
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves == 0 || (pCut->nLeaves == 1 && pCut->pLeaves[0] != pObj->Id && Aig_ManObj(p->pAig, pCut->pLeaves[0])) )
                break;
        if ( k < (int)pObj->nCuts )
        {
            assert( pCut->nLeaves < 2 );
            if ( pCut->nLeaves == 0 ) // replace by constant
            {
                assert( pCut->uTruth == 0 || pCut->uTruth == 0xFFFF );
                pObjNew = Aig_NotCond( Aig_ManConst1(p->pAig), pCut->uTruth==0 );
            }
            else
            {
                assert( pCut->uTruth == 0xAAAA || pCut->uTruth == 0x5555 );
                pObjNew = Aig_NotCond( Aig_ManObj(p->pAig, pCut->pLeaves[0]), pCut->uTruth==0x5555 );
            }
            // remove the old cuts
            Dar_ObjSetCuts( pObj, NULL );
            // replace the node
            Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
            continue;
        }

        // evaluate the cuts
        p->GainBest = -1;
        nMffcSize   = -1;
        Required    = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            int nLeavesOld = pCut->nLeaves;
            if ( pCut->nLeaves == 3 )
                pCut->pLeaves[pCut->nLeaves++] = 0;
            Dar_LibEval( p, pObj, pCut, Required, &nMffcSize );
            pCut->nLeaves = nLeavesOld; 
        }
        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
//            Aig_ObjOrderAdvance( pAig );
            continue;
        }
//        nMffcGains[p->GainBest < MAX_VAL ? p->GainBest : MAX_VAL][nMffcSize < MAX_VAL ? nMffcSize : MAX_VAL]++;
        // remove the old cuts
        Dar_ObjSetCuts( pObj, NULL );
        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_LibBuildBest( p ); // pObjNew can be complemented!
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjPhaseReal(pObjNew) ^ pObj->fPhase );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        // count gains of this class
        p->ClassGains[p->ClassBest] += nNodeBefore - nNodeAfter;
    }
//    Aig_ManOrderStop( pAig );
/*
    printf( "Distribution of gain (row) by MFFC size (column) %s 0-costs:\n", p->pPars->fUseZeros? "with":"without" );
    for ( k = 0; k <= MAX_VAL; k++ )
        printf( "<%4d> ", k );
    printf( "\n" );
    for ( i = 0; i <= MAX_VAL; i++ )
    {
        for ( k = 0; k <= MAX_VAL; k++ )
            printf( "%6d ", nMffcGains[i][k] );
        printf( "\n" );
    }
*/

p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    Dar_ManCutsFree( p );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
//    Aig_ManVerifyLevel( pAig );
    if ( p->pPars->fFanout )
        Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
    {
//        Aig_ManVerifyReverseLevel( pAig );
        Aig_ManStopReverseLevels( pAig );
    }
    if ( pAig->vProbs )
    {
        Vec_IntFree( pAig->vProbs );
        pAig->vProbs = NULL;
    }
    // stop the rewriting manager
    Dar_ManStop( p );
    Aig_ManCheckPhase( pAig );
    // check
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Aig_ManRewrite: The network check has failed.\n" );
        return 0;
    }
    return 1;
}